

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayBufferCase::createTexture
          (TexImageCubeArrayBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  TransferFormat TVar7;
  uint rowPitch;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  deUint32 buf;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_TextureCubeArraySpecCase).m_texFormat;
  TVar7 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  iVar5 = tcu::TextureFormat::getPixelSize(this_01);
  iVar8 = (this->super_TextureCubeArraySpecCase).m_size;
  iVar6 = this->m_rowLength;
  if (this->m_rowLength < 1) {
    iVar6 = iVar8;
  }
  rowPitch = -this->m_alignment & (iVar6 * iVar5 + this->m_alignment) - 1U;
  if (0 < this->m_imageHeight) {
    iVar8 = this->m_imageHeight;
  }
  iVar8 = iVar8 * rowPitch;
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->m_skipImages + (this->super_TextureCubeArraySpecCase).m_depth) *
                          iVar8 + this->m_offset));
  fVar1 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar2 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar3 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar9 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1;
  fVar10 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2;
  fVar11 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3;
  fVar12 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  colorA.m_data[0] = fVar9 * 1.0 + fVar1;
  colorA.m_data[1] = fVar10 * 0.0 + fVar2;
  colorA.m_data[2] = fVar11 * 0.0 + fVar3;
  colorA.m_data[3] = fVar12 * 1.0 + fVar4;
  colorB.m_data[0] = fVar9 * 0.0 + fVar1;
  colorB.m_data[1] = fVar10 * 1.0 + fVar2;
  colorB.m_data[2] = fVar11 * 0.0 + fVar3;
  colorB.m_data[3] = fVar12 * 1.0 + fVar4;
  iVar6 = (this->super_TextureCubeArraySpecCase).m_size;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,iVar6,iVar6,(this->super_TextureCubeArraySpecCase).m_depth,rowPitch,
             iVar8,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (long)this->m_offset +
                   (long)(iVar5 * this->m_skipPixels) + (long)(int)(this->m_skipRows * rowPitch) +
                   (long)(this->m_skipImages * iVar8));
  tcu::fillWithGrid(&local_58,4,&colorA,&colorB);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  iVar8 = (this->super_TextureCubeArraySpecCase).m_size;
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x9009,0,*(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4,iVar8,iVar8
             ,(this->super_TextureCubeArraySpecCase).m_depth,0,TVar7.format,TVar7.dataType,
             (void *)(long)this->m_offset);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_size;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_size;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(slicePitch*(m_depth+m_skipImages) + m_offset);
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, m_depth, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_internalFormat, m_size, m_size, m_depth, 0, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}